

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O0

upb_FieldType upb_MiniTableField_Type(upb_MiniTableField *f)

{
  _Bool _Var1;
  upb_FieldType type;
  upb_MiniTableField *f_local;
  
  f_local._4_4_ = (upb_FieldType)f->descriptortype_dont_copy_me__upb_internal_use_only;
  _Var1 = _upb_MiniTableField_IsAlternate_dont_copy_me__upb_internal_use_only(f);
  if (_Var1) {
    if (f_local._4_4_ == kUpb_FieldType_Int32) {
      f_local._4_4_ = kUpb_FieldType_Enum;
    }
    else {
      if (f_local._4_4_ != kUpb_FieldType_Bytes) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                      ,0x7b,
                      "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
      }
      f_local._4_4_ = kUpb_FieldType_String;
    }
  }
  return f_local._4_4_;
}

Assistant:

UPB_API_INLINE upb_FieldType
upb_MiniTableField_Type(const struct upb_MiniTableField* f) {
  const upb_FieldType type = (upb_FieldType)f->UPB_PRIVATE(descriptortype);
  if (UPB_PRIVATE(_upb_MiniTableField_IsAlternate)(f)) {
    if (type == kUpb_FieldType_Int32) return kUpb_FieldType_Enum;
    if (type == kUpb_FieldType_Bytes) return kUpb_FieldType_String;
    UPB_ASSERT(false);
  }
  return type;
}